

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O1

void read_debug_vui_parameters(sps_t *sps,bs_t *b)

{
  byte *pbVar1;
  byte *pbVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint32_t r_5;
  uint32_t r;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  FILE *pFVar10;
  uint32_t r_1;
  uint uVar11;
  bool bVar12;
  
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  uVar6 = 0;
  fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar3 = b->bits_left - 1;
  b->bits_left = uVar3;
  pbVar2 = b->p;
  if (pbVar2 < b->end) {
    uVar6 = (ulong)((*pbVar2 >> (uVar3 & 0x1f) & 1) != 0);
  }
  if (uVar3 == 0) {
    b->p = pbVar2 + 1;
    b->bits_left = 8;
  }
  (sps->vui).aspect_ratio_info_present_flag = (int)uVar6;
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  fprintf(pFVar10,"sps->vui.aspect_ratio_info_present_flag: %d \n",uVar6);
  if ((sps->vui).aspect_ratio_info_present_flag != 0) {
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    uVar6 = 0;
    fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar3 = b->bits_left;
    if ((uVar3 == 8) && (pbVar2 = b->p, pbVar2 < b->end)) {
      uVar6 = (ulong)*pbVar2;
      b->p = pbVar2 + 1;
    }
    else {
      pbVar2 = b->p;
      iVar4 = 7;
      do {
        uVar3 = uVar3 - 1;
        b->bits_left = uVar3;
        uVar11 = 0;
        if (pbVar2 < b->end) {
          uVar11 = (uint)((*pbVar2 >> (uVar3 & 0x1f) & 1) != 0);
        }
        if (uVar3 == 0) {
          pbVar2 = pbVar2 + 1;
          b->p = pbVar2;
          b->bits_left = 8;
          uVar3 = 8;
        }
        uVar6 = (ulong)((uint)uVar6 | uVar11 << ((byte)iVar4 & 0x1f));
        bVar12 = iVar4 != 0;
        iVar4 = iVar4 + -1;
      } while (bVar12);
    }
    (sps->vui).aspect_ratio_idc = (int)uVar6;
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    fprintf(pFVar10,"sps->vui.aspect_ratio_idc: %d \n",uVar6);
    if ((sps->vui).aspect_ratio_idc == 0xff) {
      pFVar10 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar10 = _stdout;
      }
      uVar11 = 0;
      fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      pbVar2 = b->p;
      uVar3 = b->bits_left;
      iVar4 = 0xf;
      do {
        uVar3 = uVar3 - 1;
        b->bits_left = uVar3;
        uVar8 = 0;
        if (pbVar2 < b->end) {
          uVar8 = (uint)((*pbVar2 >> (uVar3 & 0x1f) & 1) != 0);
        }
        if (uVar3 == 0) {
          pbVar2 = pbVar2 + 1;
          b->p = pbVar2;
          b->bits_left = 8;
          uVar3 = 8;
        }
        uVar11 = uVar11 | uVar8 << ((byte)iVar4 & 0x1f);
        bVar12 = iVar4 != 0;
        iVar4 = iVar4 + -1;
      } while (bVar12);
      (sps->vui).sar_width = uVar11;
      pFVar10 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar10 = _stdout;
      }
      uVar3 = 0;
      fprintf(pFVar10,"sps->vui.sar_width: %d \n",(ulong)uVar11);
      pFVar10 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar10 = _stdout;
      }
      fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      pbVar2 = b->p;
      uVar11 = b->bits_left;
      iVar4 = 0xf;
      do {
        uVar11 = uVar11 - 1;
        b->bits_left = uVar11;
        uVar8 = 0;
        if (pbVar2 < b->end) {
          uVar8 = (uint)((*pbVar2 >> (uVar11 & 0x1f) & 1) != 0);
        }
        if (uVar11 == 0) {
          pbVar2 = pbVar2 + 1;
          b->p = pbVar2;
          b->bits_left = 8;
          uVar11 = 8;
        }
        uVar3 = uVar3 | uVar8 << ((byte)iVar4 & 0x1f);
        bVar12 = iVar4 != 0;
        iVar4 = iVar4 + -1;
      } while (bVar12);
      (sps->vui).sar_height = uVar3;
      pFVar10 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar10 = _stdout;
      }
      fprintf(pFVar10,"sps->vui.sar_height: %d \n",(ulong)uVar3);
    }
  }
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  uVar6 = 0;
  fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar3 = b->bits_left - 1;
  b->bits_left = uVar3;
  pbVar2 = b->p;
  if (pbVar2 < b->end) {
    uVar6 = (ulong)((*pbVar2 >> (uVar3 & 0x1f) & 1) != 0);
  }
  if (uVar3 == 0) {
    b->p = pbVar2 + 1;
    b->bits_left = 8;
  }
  (sps->vui).overscan_info_present_flag = (int)uVar6;
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  fprintf(pFVar10,"sps->vui.overscan_info_present_flag: %d \n",uVar6);
  if ((sps->vui).overscan_info_present_flag != 0) {
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    uVar6 = 0;
    fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar3 = b->bits_left - 1;
    b->bits_left = uVar3;
    pbVar2 = b->p;
    if (pbVar2 < b->end) {
      uVar6 = (ulong)((*pbVar2 >> (uVar3 & 0x1f) & 1) != 0);
    }
    if (uVar3 == 0) {
      b->p = pbVar2 + 1;
      b->bits_left = 8;
    }
    (sps->vui).overscan_appropriate_flag = (int)uVar6;
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    fprintf(pFVar10,"sps->vui.overscan_appropriate_flag: %d \n",uVar6);
  }
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  uVar6 = 0;
  fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar3 = b->bits_left - 1;
  b->bits_left = uVar3;
  pbVar2 = b->p;
  if (pbVar2 < b->end) {
    uVar6 = (ulong)((*pbVar2 >> (uVar3 & 0x1f) & 1) != 0);
  }
  if (uVar3 == 0) {
    b->p = pbVar2 + 1;
    b->bits_left = 8;
  }
  (sps->vui).video_signal_type_present_flag = (int)uVar6;
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  fprintf(pFVar10,"sps->vui.video_signal_type_present_flag: %d \n",uVar6);
  if ((sps->vui).video_signal_type_present_flag != 0) {
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    uVar11 = 0;
    fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar2 = b->p;
    uVar3 = b->bits_left;
    iVar4 = 2;
    do {
      uVar3 = uVar3 - 1;
      b->bits_left = uVar3;
      uVar8 = 0;
      if (pbVar2 < b->end) {
        uVar8 = (uint)((*pbVar2 >> (uVar3 & 0x1f) & 1) != 0);
      }
      if (uVar3 == 0) {
        pbVar2 = pbVar2 + 1;
        b->p = pbVar2;
        b->bits_left = 8;
        uVar3 = 8;
      }
      uVar11 = uVar11 | uVar8 << ((byte)iVar4 & 0x1f);
      bVar12 = iVar4 != 0;
      iVar4 = iVar4 + -1;
    } while (bVar12);
    (sps->vui).video_format = uVar11;
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    uVar6 = 0;
    fprintf(pFVar10,"sps->vui.video_format: %d \n",(ulong)uVar11);
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar3 = b->bits_left - 1;
    b->bits_left = uVar3;
    pbVar2 = b->p;
    if (pbVar2 < b->end) {
      uVar6 = (ulong)((*pbVar2 >> (uVar3 & 0x1f) & 1) != 0);
    }
    if (uVar3 == 0) {
      b->p = pbVar2 + 1;
      b->bits_left = 8;
    }
    (sps->vui).video_full_range_flag = (int)uVar6;
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    uVar7 = 0;
    fprintf(pFVar10,"sps->vui.video_full_range_flag: %d \n",uVar6);
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar3 = b->bits_left - 1;
    b->bits_left = uVar3;
    pbVar2 = b->p;
    if (pbVar2 < b->end) {
      uVar7 = (ulong)((*pbVar2 >> (uVar3 & 0x1f) & 1) != 0);
    }
    if (uVar3 == 0) {
      b->p = pbVar2 + 1;
      b->bits_left = 8;
    }
    (sps->vui).colour_description_present_flag = (int)uVar7;
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    fprintf(pFVar10,"sps->vui.colour_description_present_flag: %d \n",uVar7);
    if ((sps->vui).colour_description_present_flag != 0) {
      pFVar10 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar10 = _stdout;
      }
      uVar6 = 0;
      fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar3 = b->bits_left;
      if ((uVar3 == 8) && (pbVar2 = b->p, pbVar2 < b->end)) {
        uVar6 = (ulong)*pbVar2;
        b->p = pbVar2 + 1;
      }
      else {
        pbVar2 = b->p;
        iVar4 = 7;
        do {
          uVar3 = uVar3 - 1;
          b->bits_left = uVar3;
          uVar11 = 0;
          if (pbVar2 < b->end) {
            uVar11 = (uint)((*pbVar2 >> (uVar3 & 0x1f) & 1) != 0);
          }
          if (uVar3 == 0) {
            pbVar2 = pbVar2 + 1;
            b->p = pbVar2;
            b->bits_left = 8;
            uVar3 = 8;
          }
          uVar6 = (ulong)((uint)uVar6 | uVar11 << ((byte)iVar4 & 0x1f));
          bVar12 = iVar4 != 0;
          iVar4 = iVar4 + -1;
        } while (bVar12);
      }
      (sps->vui).colour_primaries = (int)uVar6;
      pFVar10 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar10 = _stdout;
      }
      fprintf(pFVar10,"sps->vui.colour_primaries: %d \n",uVar6);
      pFVar10 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar10 = _stdout;
      }
      fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar3 = b->bits_left;
      if ((uVar3 == 8) && (pbVar2 = b->p, pbVar2 < b->end)) {
        uVar11 = (uint)*pbVar2;
        b->p = pbVar2 + 1;
      }
      else {
        pbVar2 = b->p;
        uVar11 = 0;
        iVar4 = 7;
        do {
          uVar3 = uVar3 - 1;
          b->bits_left = uVar3;
          uVar8 = 0;
          if (pbVar2 < b->end) {
            uVar8 = (uint)((*pbVar2 >> (uVar3 & 0x1f) & 1) != 0);
          }
          if (uVar3 == 0) {
            pbVar2 = pbVar2 + 1;
            b->p = pbVar2;
            b->bits_left = 8;
            uVar3 = 8;
          }
          uVar11 = uVar11 | uVar8 << ((byte)iVar4 & 0x1f);
          bVar12 = iVar4 != 0;
          iVar4 = iVar4 + -1;
        } while (bVar12);
      }
      (sps->vui).transfer_characteristics = uVar11;
      pFVar10 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar10 = _stdout;
      }
      fprintf(pFVar10,"sps->vui.transfer_characteristics: %d \n");
      pFVar10 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar10 = _stdout;
      }
      fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar3 = b->bits_left;
      if ((uVar3 == 8) && (pbVar2 = b->p, pbVar2 < b->end)) {
        uVar11 = (uint)*pbVar2;
        b->p = pbVar2 + 1;
      }
      else {
        pbVar2 = b->p;
        uVar11 = 0;
        iVar4 = 7;
        do {
          uVar3 = uVar3 - 1;
          b->bits_left = uVar3;
          uVar8 = 0;
          if (pbVar2 < b->end) {
            uVar8 = (uint)((*pbVar2 >> (uVar3 & 0x1f) & 1) != 0);
          }
          if (uVar3 == 0) {
            pbVar2 = pbVar2 + 1;
            b->p = pbVar2;
            b->bits_left = 8;
            uVar3 = 8;
          }
          uVar11 = uVar11 | uVar8 << ((byte)iVar4 & 0x1f);
          bVar12 = iVar4 != 0;
          iVar4 = iVar4 + -1;
        } while (bVar12);
      }
      (sps->vui).matrix_coefficients = uVar11;
      pFVar10 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar10 = _stdout;
      }
      fprintf(pFVar10,"sps->vui.matrix_coefficients: %d \n");
    }
  }
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  uVar6 = 0;
  fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar3 = b->bits_left - 1;
  b->bits_left = uVar3;
  pbVar2 = b->p;
  if (pbVar2 < b->end) {
    uVar6 = (ulong)((*pbVar2 >> (uVar3 & 0x1f) & 1) != 0);
  }
  if (uVar3 == 0) {
    b->p = pbVar2 + 1;
    b->bits_left = 8;
  }
  (sps->vui).chroma_loc_info_present_flag = (int)uVar6;
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  fprintf(pFVar10,"sps->vui.chroma_loc_info_present_flag: %d \n",uVar6);
  if ((sps->vui).chroma_loc_info_present_flag != 0) {
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    iVar4 = 0;
    fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar2 = b->p;
    pbVar1 = b->end;
    uVar3 = b->bits_left;
    uVar11 = 0xffffffff;
    do {
      uVar3 = uVar3 - 1;
      b->bits_left = uVar3;
      bVar12 = true;
      if (pbVar2 < pbVar1) {
        bVar12 = (*pbVar2 >> (uVar3 & 0x1f) & 1) == 0;
      }
      if (uVar3 == 0) {
        pbVar2 = pbVar2 + 1;
        b->p = pbVar2;
        b->bits_left = 8;
        uVar3 = 8;
      }
      uVar11 = uVar11 + 1;
      iVar4 = iVar4 + -1;
    } while (((bool)(bVar12 & uVar11 < 0x20)) && (pbVar2 < pbVar1));
    if (iVar4 == -1) {
      uVar3 = 0;
    }
    else {
      iVar5 = -2 - iVar4;
      iVar9 = -3 - iVar4;
      uVar11 = b->bits_left;
      pbVar2 = b->p;
      uVar3 = 0;
      do {
        uVar11 = uVar11 - 1;
        b->bits_left = uVar11;
        uVar8 = 0;
        if (pbVar2 < pbVar1) {
          uVar8 = (uint)((*pbVar2 >> (uVar11 & 0x1f) & 1) != 0);
        }
        if (uVar11 == 0) {
          pbVar2 = pbVar2 + 1;
          b->p = pbVar2;
          b->bits_left = 8;
          uVar11 = 8;
        }
        uVar3 = uVar3 | uVar8 << ((byte)iVar5 & 0x1f);
        iVar9 = iVar9 + -1;
        iVar5 = iVar5 + -1;
      } while (iVar9 != -2);
    }
    uVar11 = 0xffffffff;
    (sps->vui).chroma_sample_loc_type_top_field = ~(-1 << (~(byte)iVar4 & 0x1f)) + uVar3;
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    iVar4 = 0;
    fprintf(pFVar10,"sps->vui.chroma_sample_loc_type_top_field: %d \n");
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar2 = b->p;
    pbVar1 = b->end;
    uVar3 = b->bits_left;
    do {
      uVar3 = uVar3 - 1;
      b->bits_left = uVar3;
      bVar12 = true;
      if (pbVar2 < pbVar1) {
        bVar12 = (*pbVar2 >> (uVar3 & 0x1f) & 1) == 0;
      }
      if (uVar3 == 0) {
        pbVar2 = pbVar2 + 1;
        b->p = pbVar2;
        b->bits_left = 8;
        uVar3 = 8;
      }
      uVar11 = uVar11 + 1;
      iVar4 = iVar4 + -1;
    } while (((bool)(bVar12 & uVar11 < 0x20)) && (pbVar2 < pbVar1));
    if (iVar4 == -1) {
      uVar3 = 0;
    }
    else {
      iVar5 = -2 - iVar4;
      iVar9 = -3 - iVar4;
      uVar11 = b->bits_left;
      pbVar2 = b->p;
      uVar3 = 0;
      do {
        uVar11 = uVar11 - 1;
        b->bits_left = uVar11;
        uVar8 = 0;
        if (pbVar2 < pbVar1) {
          uVar8 = (uint)((*pbVar2 >> (uVar11 & 0x1f) & 1) != 0);
        }
        if (uVar11 == 0) {
          pbVar2 = pbVar2 + 1;
          b->p = pbVar2;
          b->bits_left = 8;
          uVar11 = 8;
        }
        uVar3 = uVar3 | uVar8 << ((byte)iVar5 & 0x1f);
        iVar9 = iVar9 + -1;
        iVar5 = iVar5 + -1;
      } while (iVar9 != -2);
    }
    (sps->vui).chroma_sample_loc_type_bottom_field = ~(-1 << (~(byte)iVar4 & 0x1f)) + uVar3;
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    fprintf(pFVar10,"sps->vui.chroma_sample_loc_type_bottom_field: %d \n");
  }
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  uVar6 = 0;
  fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar3 = b->bits_left - 1;
  b->bits_left = uVar3;
  pbVar2 = b->p;
  if (pbVar2 < b->end) {
    uVar6 = (ulong)((*pbVar2 >> (uVar3 & 0x1f) & 1) != 0);
  }
  if (uVar3 == 0) {
    b->p = pbVar2 + 1;
    b->bits_left = 8;
  }
  (sps->vui).timing_info_present_flag = (int)uVar6;
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  fprintf(pFVar10,"sps->vui.timing_info_present_flag: %d \n",uVar6);
  if ((sps->vui).timing_info_present_flag != 0) {
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    uVar11 = 0;
    fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar2 = b->p;
    uVar3 = b->bits_left;
    iVar4 = 0x1f;
    do {
      uVar3 = uVar3 - 1;
      b->bits_left = uVar3;
      uVar8 = 0;
      if (pbVar2 < b->end) {
        uVar8 = (uint)((*pbVar2 >> (uVar3 & 0x1f) & 1) != 0);
      }
      if (uVar3 == 0) {
        pbVar2 = pbVar2 + 1;
        b->p = pbVar2;
        b->bits_left = 8;
        uVar3 = 8;
      }
      uVar11 = uVar11 | uVar8 << ((byte)iVar4 & 0x1f);
      bVar12 = iVar4 != 0;
      iVar4 = iVar4 + -1;
    } while (bVar12);
    (sps->vui).num_units_in_tick = uVar11;
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    uVar3 = 0;
    fprintf(pFVar10,"sps->vui.num_units_in_tick: %d \n",(ulong)uVar11);
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar2 = b->p;
    uVar11 = b->bits_left;
    iVar4 = 0x1f;
    do {
      uVar11 = uVar11 - 1;
      b->bits_left = uVar11;
      uVar8 = 0;
      if (pbVar2 < b->end) {
        uVar8 = (uint)((*pbVar2 >> (uVar11 & 0x1f) & 1) != 0);
      }
      if (uVar11 == 0) {
        pbVar2 = pbVar2 + 1;
        b->p = pbVar2;
        b->bits_left = 8;
        uVar11 = 8;
      }
      uVar3 = uVar3 | uVar8 << ((byte)iVar4 & 0x1f);
      bVar12 = iVar4 != 0;
      iVar4 = iVar4 + -1;
    } while (bVar12);
    (sps->vui).time_scale = uVar3;
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    uVar6 = 0;
    fprintf(pFVar10,"sps->vui.time_scale: %d \n",(ulong)uVar3);
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar3 = b->bits_left - 1;
    b->bits_left = uVar3;
    pbVar2 = b->p;
    if (pbVar2 < b->end) {
      uVar6 = (ulong)((*pbVar2 >> (uVar3 & 0x1f) & 1) != 0);
    }
    if (uVar3 == 0) {
      b->p = pbVar2 + 1;
      b->bits_left = 8;
    }
    (sps->vui).fixed_frame_rate_flag = (int)uVar6;
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    fprintf(pFVar10,"sps->vui.fixed_frame_rate_flag: %d \n",uVar6);
  }
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  uVar11 = 0;
  fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar3 = b->bits_left - 1;
  b->bits_left = uVar3;
  pbVar2 = b->p;
  if (pbVar2 < b->end) {
    uVar11 = (uint)((*pbVar2 >> (uVar3 & 0x1f) & 1) != 0);
  }
  if (uVar3 == 0) {
    b->p = pbVar2 + 1;
    b->bits_left = 8;
  }
  (sps->vui).nal_hrd_parameters_present_flag = uVar11;
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  fprintf(pFVar10,"sps->vui.nal_hrd_parameters_present_flag: %d \n",(ulong)uVar11);
  if ((sps->vui).nal_hrd_parameters_present_flag != 0) {
    read_debug_hrd_parameters(&sps->hrd_nal,b);
  }
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  uVar6 = 0;
  fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar3 = b->bits_left - 1;
  b->bits_left = uVar3;
  pbVar2 = b->p;
  if (pbVar2 < b->end) {
    uVar6 = (ulong)((*pbVar2 >> (uVar3 & 0x1f) & 1) != 0);
  }
  if (uVar3 == 0) {
    b->p = pbVar2 + 1;
    b->bits_left = 8;
  }
  (sps->vui).vcl_hrd_parameters_present_flag = (int)uVar6;
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  fprintf(pFVar10,"sps->vui.vcl_hrd_parameters_present_flag: %d \n",uVar6);
  if ((sps->vui).vcl_hrd_parameters_present_flag != 0) {
    read_debug_hrd_parameters(&sps->hrd_vcl,b);
  }
  if (((sps->vui).nal_hrd_parameters_present_flag != 0) ||
     ((sps->vui).vcl_hrd_parameters_present_flag != 0)) {
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    uVar6 = 0;
    fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar3 = b->bits_left - 1;
    b->bits_left = uVar3;
    pbVar2 = b->p;
    if (pbVar2 < b->end) {
      uVar6 = (ulong)((*pbVar2 >> (uVar3 & 0x1f) & 1) != 0);
    }
    if (uVar3 == 0) {
      b->p = pbVar2 + 1;
      b->bits_left = 8;
    }
    (sps->vui).low_delay_hrd_flag = (int)uVar6;
    pFVar10 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar10 = _stdout;
    }
    fprintf(pFVar10,"sps->vui.low_delay_hrd_flag: %d \n",uVar6);
  }
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  uVar11 = 0;
  fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar3 = b->bits_left - 1;
  b->bits_left = uVar3;
  pbVar2 = b->p;
  if (pbVar2 < b->end) {
    uVar11 = (uint)((*pbVar2 >> (uVar3 & 0x1f) & 1) != 0);
  }
  if (uVar3 == 0) {
    b->p = pbVar2 + 1;
    b->bits_left = 8;
  }
  (sps->vui).pic_struct_present_flag = uVar11;
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  uVar3 = 0;
  fprintf(pFVar10,"sps->vui.pic_struct_present_flag: %d \n",(ulong)uVar11);
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar11 = b->bits_left - 1;
  b->bits_left = uVar11;
  pbVar2 = b->p;
  if (pbVar2 < b->end) {
    uVar3 = (uint)((*pbVar2 >> (uVar11 & 0x1f) & 1) != 0);
  }
  if (uVar11 == 0) {
    b->p = pbVar2 + 1;
    b->bits_left = 8;
  }
  (sps->vui).bitstream_restriction_flag = uVar3;
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  fprintf(pFVar10,"sps->vui.bitstream_restriction_flag: %d \n",(ulong)uVar3);
  if ((sps->vui).bitstream_restriction_flag == 0) {
    return;
  }
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  uVar11 = 0;
  fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar3 = b->bits_left - 1;
  b->bits_left = uVar3;
  pbVar2 = b->p;
  if (pbVar2 < b->end) {
    uVar11 = (uint)((*pbVar2 >> (uVar3 & 0x1f) & 1) != 0);
  }
  if (uVar3 == 0) {
    b->p = pbVar2 + 1;
    b->bits_left = 8;
  }
  (sps->vui).motion_vectors_over_pic_boundaries_flag = uVar11;
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  iVar4 = 0;
  fprintf(pFVar10,"sps->vui.motion_vectors_over_pic_boundaries_flag: %d \n",(ulong)uVar11);
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar2 = b->p;
  pbVar1 = b->end;
  uVar3 = b->bits_left;
  uVar11 = 0xffffffff;
  do {
    uVar3 = uVar3 - 1;
    b->bits_left = uVar3;
    bVar12 = true;
    if (pbVar2 < pbVar1) {
      bVar12 = (*pbVar2 >> (uVar3 & 0x1f) & 1) == 0;
    }
    if (uVar3 == 0) {
      pbVar2 = pbVar2 + 1;
      b->p = pbVar2;
      b->bits_left = 8;
      uVar3 = 8;
    }
    uVar11 = uVar11 + 1;
    iVar4 = iVar4 + -1;
  } while (((bool)(bVar12 & uVar11 < 0x20)) && (pbVar2 < pbVar1));
  if (iVar4 == -1) {
    uVar3 = 0;
  }
  else {
    iVar5 = -2 - iVar4;
    iVar9 = -3 - iVar4;
    uVar11 = b->bits_left;
    pbVar2 = b->p;
    uVar3 = 0;
    do {
      uVar11 = uVar11 - 1;
      b->bits_left = uVar11;
      uVar8 = 0;
      if (pbVar2 < pbVar1) {
        uVar8 = (uint)((*pbVar2 >> (uVar11 & 0x1f) & 1) != 0);
      }
      if (uVar11 == 0) {
        pbVar2 = pbVar2 + 1;
        b->p = pbVar2;
        b->bits_left = 8;
        uVar11 = 8;
      }
      uVar3 = uVar3 | uVar8 << ((byte)iVar5 & 0x1f);
      iVar9 = iVar9 + -1;
      iVar5 = iVar5 + -1;
    } while (iVar9 != -2);
  }
  uVar11 = 0xffffffff;
  (sps->vui).max_bytes_per_pic_denom = ~(-1 << (~(byte)iVar4 & 0x1f)) + uVar3;
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  iVar4 = 0;
  fprintf(pFVar10,"sps->vui.max_bytes_per_pic_denom: %d \n");
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar2 = b->p;
  pbVar1 = b->end;
  uVar3 = b->bits_left;
  do {
    uVar3 = uVar3 - 1;
    b->bits_left = uVar3;
    bVar12 = true;
    if (pbVar2 < pbVar1) {
      bVar12 = (*pbVar2 >> (uVar3 & 0x1f) & 1) == 0;
    }
    if (uVar3 == 0) {
      pbVar2 = pbVar2 + 1;
      b->p = pbVar2;
      b->bits_left = 8;
      uVar3 = 8;
    }
    uVar11 = uVar11 + 1;
    iVar4 = iVar4 + -1;
  } while (((bool)(bVar12 & uVar11 < 0x20)) && (pbVar2 < pbVar1));
  if (iVar4 == -1) {
    uVar3 = 0;
  }
  else {
    iVar5 = -2 - iVar4;
    iVar9 = -3 - iVar4;
    uVar11 = b->bits_left;
    pbVar2 = b->p;
    uVar3 = 0;
    do {
      uVar11 = uVar11 - 1;
      b->bits_left = uVar11;
      uVar8 = 0;
      if (pbVar2 < pbVar1) {
        uVar8 = (uint)((*pbVar2 >> (uVar11 & 0x1f) & 1) != 0);
      }
      if (uVar11 == 0) {
        pbVar2 = pbVar2 + 1;
        b->p = pbVar2;
        b->bits_left = 8;
        uVar11 = 8;
      }
      uVar3 = uVar3 | uVar8 << ((byte)iVar5 & 0x1f);
      iVar9 = iVar9 + -1;
      iVar5 = iVar5 + -1;
    } while (iVar9 != -2);
  }
  uVar11 = 0xffffffff;
  (sps->vui).max_bits_per_mb_denom = ~(-1 << (~(byte)iVar4 & 0x1f)) + uVar3;
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  iVar4 = 0;
  fprintf(pFVar10,"sps->vui.max_bits_per_mb_denom: %d \n");
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar2 = b->p;
  pbVar1 = b->end;
  uVar3 = b->bits_left;
  do {
    uVar3 = uVar3 - 1;
    b->bits_left = uVar3;
    bVar12 = true;
    if (pbVar2 < pbVar1) {
      bVar12 = (*pbVar2 >> (uVar3 & 0x1f) & 1) == 0;
    }
    if (uVar3 == 0) {
      pbVar2 = pbVar2 + 1;
      b->p = pbVar2;
      b->bits_left = 8;
      uVar3 = 8;
    }
    uVar11 = uVar11 + 1;
    iVar4 = iVar4 + -1;
  } while (((bool)(bVar12 & uVar11 < 0x20)) && (pbVar2 < pbVar1));
  if (iVar4 == -1) {
    uVar3 = 0;
  }
  else {
    iVar5 = -2 - iVar4;
    iVar9 = -3 - iVar4;
    uVar11 = b->bits_left;
    pbVar2 = b->p;
    uVar3 = 0;
    do {
      uVar11 = uVar11 - 1;
      b->bits_left = uVar11;
      uVar8 = 0;
      if (pbVar2 < pbVar1) {
        uVar8 = (uint)((*pbVar2 >> (uVar11 & 0x1f) & 1) != 0);
      }
      if (uVar11 == 0) {
        pbVar2 = pbVar2 + 1;
        b->p = pbVar2;
        b->bits_left = 8;
        uVar11 = 8;
      }
      uVar3 = uVar3 | uVar8 << ((byte)iVar5 & 0x1f);
      iVar9 = iVar9 + -1;
      iVar5 = iVar5 + -1;
    } while (iVar9 != -2);
  }
  uVar11 = 0xffffffff;
  (sps->vui).log2_max_mv_length_horizontal = ~(-1 << (~(byte)iVar4 & 0x1f)) + uVar3;
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  iVar4 = 0;
  fprintf(pFVar10,"sps->vui.log2_max_mv_length_horizontal: %d \n");
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar2 = b->p;
  pbVar1 = b->end;
  uVar3 = b->bits_left;
  do {
    uVar3 = uVar3 - 1;
    b->bits_left = uVar3;
    bVar12 = true;
    if (pbVar2 < pbVar1) {
      bVar12 = (*pbVar2 >> (uVar3 & 0x1f) & 1) == 0;
    }
    if (uVar3 == 0) {
      pbVar2 = pbVar2 + 1;
      b->p = pbVar2;
      b->bits_left = 8;
      uVar3 = 8;
    }
    uVar11 = uVar11 + 1;
    iVar4 = iVar4 + -1;
  } while (((bool)(bVar12 & uVar11 < 0x20)) && (pbVar2 < pbVar1));
  if (iVar4 == -1) {
    uVar3 = 0;
  }
  else {
    iVar5 = -2 - iVar4;
    iVar9 = -3 - iVar4;
    uVar11 = b->bits_left;
    pbVar2 = b->p;
    uVar3 = 0;
    do {
      uVar11 = uVar11 - 1;
      b->bits_left = uVar11;
      uVar8 = 0;
      if (pbVar2 < pbVar1) {
        uVar8 = (uint)((*pbVar2 >> (uVar11 & 0x1f) & 1) != 0);
      }
      if (uVar11 == 0) {
        pbVar2 = pbVar2 + 1;
        b->p = pbVar2;
        b->bits_left = 8;
        uVar11 = 8;
      }
      uVar3 = uVar3 | uVar8 << ((byte)iVar5 & 0x1f);
      iVar9 = iVar9 + -1;
      iVar5 = iVar5 + -1;
    } while (iVar9 != -2);
  }
  uVar11 = 0xffffffff;
  (sps->vui).log2_max_mv_length_vertical = ~(-1 << (~(byte)iVar4 & 0x1f)) + uVar3;
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  iVar4 = 0;
  fprintf(pFVar10,"sps->vui.log2_max_mv_length_vertical: %d \n");
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar2 = b->p;
  pbVar1 = b->end;
  uVar3 = b->bits_left;
  do {
    uVar3 = uVar3 - 1;
    b->bits_left = uVar3;
    bVar12 = true;
    if (pbVar2 < pbVar1) {
      bVar12 = (*pbVar2 >> (uVar3 & 0x1f) & 1) == 0;
    }
    if (uVar3 == 0) {
      pbVar2 = pbVar2 + 1;
      b->p = pbVar2;
      b->bits_left = 8;
      uVar3 = 8;
    }
    uVar11 = uVar11 + 1;
    iVar4 = iVar4 + -1;
  } while (((bool)(bVar12 & uVar11 < 0x20)) && (pbVar2 < pbVar1));
  if (iVar4 == -1) {
    uVar3 = 0;
  }
  else {
    iVar5 = -2 - iVar4;
    iVar9 = -3 - iVar4;
    uVar11 = b->bits_left;
    pbVar2 = b->p;
    uVar3 = 0;
    do {
      uVar11 = uVar11 - 1;
      b->bits_left = uVar11;
      uVar8 = 0;
      if (pbVar2 < pbVar1) {
        uVar8 = (uint)((*pbVar2 >> (uVar11 & 0x1f) & 1) != 0);
      }
      if (uVar11 == 0) {
        pbVar2 = pbVar2 + 1;
        b->p = pbVar2;
        b->bits_left = 8;
        uVar11 = 8;
      }
      uVar3 = uVar3 | uVar8 << ((byte)iVar5 & 0x1f);
      iVar9 = iVar9 + -1;
      iVar5 = iVar5 + -1;
    } while (iVar9 != -2);
  }
  uVar11 = 0xffffffff;
  (sps->vui).num_reorder_frames = ~(-1 << (~(byte)iVar4 & 0x1f)) + uVar3;
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  iVar4 = 0;
  fprintf(pFVar10,"sps->vui.num_reorder_frames: %d \n");
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  fprintf(pFVar10,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar2 = b->p;
  pbVar1 = b->end;
  uVar3 = b->bits_left;
  do {
    uVar3 = uVar3 - 1;
    b->bits_left = uVar3;
    bVar12 = true;
    if (pbVar2 < pbVar1) {
      bVar12 = (*pbVar2 >> (uVar3 & 0x1f) & 1) == 0;
    }
    if (uVar3 == 0) {
      pbVar2 = pbVar2 + 1;
      b->p = pbVar2;
      b->bits_left = 8;
      uVar3 = 8;
    }
    uVar11 = uVar11 + 1;
    iVar4 = iVar4 + -1;
  } while (((bool)(bVar12 & uVar11 < 0x20)) && (pbVar2 < pbVar1));
  if (iVar4 == -1) {
    uVar3 = 0;
  }
  else {
    iVar5 = -2 - iVar4;
    iVar9 = -3 - iVar4;
    uVar11 = b->bits_left;
    pbVar2 = b->p;
    uVar3 = 0;
    do {
      uVar11 = uVar11 - 1;
      b->bits_left = uVar11;
      uVar8 = 0;
      if (pbVar2 < pbVar1) {
        uVar8 = (uint)((*pbVar2 >> (uVar11 & 0x1f) & 1) != 0);
      }
      if (uVar11 == 0) {
        pbVar2 = pbVar2 + 1;
        b->p = pbVar2;
        b->bits_left = 8;
        uVar11 = 8;
      }
      uVar3 = uVar3 | uVar8 << ((byte)iVar5 & 0x1f);
      iVar9 = iVar9 + -1;
      iVar5 = iVar5 + -1;
    } while (iVar9 != -2);
  }
  (sps->vui).max_dec_frame_buffering = ~(-1 << (~(byte)iVar4 & 0x1f)) + uVar3;
  pFVar10 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar10 = _stdout;
  }
  fprintf(pFVar10,"sps->vui.max_dec_frame_buffering: %d \n");
  return;
}

Assistant:

void read_debug_vui_parameters(sps_t* sps, bs_t* b)
{
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.aspect_ratio_info_present_flag = bs_read_u1(b); printf("sps->vui.aspect_ratio_info_present_flag: %d \n", sps->vui.aspect_ratio_info_present_flag); 
    if( sps->vui.aspect_ratio_info_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.aspect_ratio_idc = bs_read_u8(b); printf("sps->vui.aspect_ratio_idc: %d \n", sps->vui.aspect_ratio_idc); 
        if( sps->vui.aspect_ratio_idc == SAR_Extended )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.sar_width = bs_read_u(b, 16); printf("sps->vui.sar_width: %d \n", sps->vui.sar_width); 
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.sar_height = bs_read_u(b, 16); printf("sps->vui.sar_height: %d \n", sps->vui.sar_height); 
        }
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.overscan_info_present_flag = bs_read_u1(b); printf("sps->vui.overscan_info_present_flag: %d \n", sps->vui.overscan_info_present_flag); 
    if( sps->vui.overscan_info_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.overscan_appropriate_flag = bs_read_u1(b); printf("sps->vui.overscan_appropriate_flag: %d \n", sps->vui.overscan_appropriate_flag); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.video_signal_type_present_flag = bs_read_u1(b); printf("sps->vui.video_signal_type_present_flag: %d \n", sps->vui.video_signal_type_present_flag); 
    if( sps->vui.video_signal_type_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.video_format = bs_read_u(b, 3); printf("sps->vui.video_format: %d \n", sps->vui.video_format); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.video_full_range_flag = bs_read_u1(b); printf("sps->vui.video_full_range_flag: %d \n", sps->vui.video_full_range_flag); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.colour_description_present_flag = bs_read_u1(b); printf("sps->vui.colour_description_present_flag: %d \n", sps->vui.colour_description_present_flag); 
        if( sps->vui.colour_description_present_flag )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.colour_primaries = bs_read_u8(b); printf("sps->vui.colour_primaries: %d \n", sps->vui.colour_primaries); 
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.transfer_characteristics = bs_read_u8(b); printf("sps->vui.transfer_characteristics: %d \n", sps->vui.transfer_characteristics); 
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.matrix_coefficients = bs_read_u8(b); printf("sps->vui.matrix_coefficients: %d \n", sps->vui.matrix_coefficients); 
        }
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.chroma_loc_info_present_flag = bs_read_u1(b); printf("sps->vui.chroma_loc_info_present_flag: %d \n", sps->vui.chroma_loc_info_present_flag); 
    if( sps->vui.chroma_loc_info_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.chroma_sample_loc_type_top_field = bs_read_ue(b); printf("sps->vui.chroma_sample_loc_type_top_field: %d \n", sps->vui.chroma_sample_loc_type_top_field); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.chroma_sample_loc_type_bottom_field = bs_read_ue(b); printf("sps->vui.chroma_sample_loc_type_bottom_field: %d \n", sps->vui.chroma_sample_loc_type_bottom_field); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.timing_info_present_flag = bs_read_u1(b); printf("sps->vui.timing_info_present_flag: %d \n", sps->vui.timing_info_present_flag); 
    if( sps->vui.timing_info_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.num_units_in_tick = bs_read_u(b, 32); printf("sps->vui.num_units_in_tick: %d \n", sps->vui.num_units_in_tick); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.time_scale = bs_read_u(b, 32); printf("sps->vui.time_scale: %d \n", sps->vui.time_scale); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.fixed_frame_rate_flag = bs_read_u1(b); printf("sps->vui.fixed_frame_rate_flag: %d \n", sps->vui.fixed_frame_rate_flag); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.nal_hrd_parameters_present_flag = bs_read_u1(b); printf("sps->vui.nal_hrd_parameters_present_flag: %d \n", sps->vui.nal_hrd_parameters_present_flag); 
    if( sps->vui.nal_hrd_parameters_present_flag )
    {
        read_debug_hrd_parameters(&sps->hrd_nal, b);
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.vcl_hrd_parameters_present_flag = bs_read_u1(b); printf("sps->vui.vcl_hrd_parameters_present_flag: %d \n", sps->vui.vcl_hrd_parameters_present_flag); 
    if( sps->vui.vcl_hrd_parameters_present_flag )
    {
        read_debug_hrd_parameters(&sps->hrd_vcl, b);
    }
    if( sps->vui.nal_hrd_parameters_present_flag || sps->vui.vcl_hrd_parameters_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.low_delay_hrd_flag = bs_read_u1(b); printf("sps->vui.low_delay_hrd_flag: %d \n", sps->vui.low_delay_hrd_flag); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.pic_struct_present_flag = bs_read_u1(b); printf("sps->vui.pic_struct_present_flag: %d \n", sps->vui.pic_struct_present_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.bitstream_restriction_flag = bs_read_u1(b); printf("sps->vui.bitstream_restriction_flag: %d \n", sps->vui.bitstream_restriction_flag); 
    if( sps->vui.bitstream_restriction_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.motion_vectors_over_pic_boundaries_flag = bs_read_u1(b); printf("sps->vui.motion_vectors_over_pic_boundaries_flag: %d \n", sps->vui.motion_vectors_over_pic_boundaries_flag); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.max_bytes_per_pic_denom = bs_read_ue(b); printf("sps->vui.max_bytes_per_pic_denom: %d \n", sps->vui.max_bytes_per_pic_denom); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.max_bits_per_mb_denom = bs_read_ue(b); printf("sps->vui.max_bits_per_mb_denom: %d \n", sps->vui.max_bits_per_mb_denom); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.log2_max_mv_length_horizontal = bs_read_ue(b); printf("sps->vui.log2_max_mv_length_horizontal: %d \n", sps->vui.log2_max_mv_length_horizontal); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.log2_max_mv_length_vertical = bs_read_ue(b); printf("sps->vui.log2_max_mv_length_vertical: %d \n", sps->vui.log2_max_mv_length_vertical); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.num_reorder_frames = bs_read_ue(b); printf("sps->vui.num_reorder_frames: %d \n", sps->vui.num_reorder_frames); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.max_dec_frame_buffering = bs_read_ue(b); printf("sps->vui.max_dec_frame_buffering: %d \n", sps->vui.max_dec_frame_buffering); 
    }
}